

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qfbvthandler_p.cpp
# Opt level: O1

void QFbVtHandler::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QFbVtHandler_to_subr *candidate;
  undefined4 uVar2;
  int iVar3;
  
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if ((((code *)*plVar1 != interrupted) || (uVar2 = 0, plVar1[1] != 0)) &&
       (((code *)*plVar1 != aboutToSuspend || (uVar2 = 1, plVar1[1] != 0)))) {
      if ((code *)*plVar1 != resumed) {
        return;
      }
      uVar2 = 2;
      if (plVar1[1] != 0) {
        return;
      }
    }
    *(undefined4 *)*_a = uVar2;
    return;
  }
  if (_c != InvokeMetaMethod) {
    return;
  }
  switch(_id) {
  case 0:
    iVar3 = 0;
    break;
  case 1:
    iVar3 = 1;
    break;
  case 2:
    iVar3 = 2;
    break;
  case 3:
    handleSignal((QFbVtHandler *)_o);
  default:
    goto LAB_0011df79;
  }
  QMetaObject::activate(_o,&staticMetaObject,iVar3,(void **)0x0);
LAB_0011df79:
  return;
}

Assistant:

void QFbVtHandler::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QFbVtHandler *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->interrupted(); break;
        case 1: _t->aboutToSuspend(); break;
        case 2: _t->resumed(); break;
        case 3: _t->handleSignal(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QFbVtHandler::*)()>(_a, &QFbVtHandler::interrupted, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFbVtHandler::*)()>(_a, &QFbVtHandler::aboutToSuspend, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QFbVtHandler::*)()>(_a, &QFbVtHandler::resumed, 2))
            return;
    }
}